

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O0

void push_job(parse_t *ps)

{
  uint uVar1;
  ctor_f *pcVar2;
  size_t sVar3;
  UT_array *pUVar4;
  char *pcVar5;
  uint local_18;
  uint local_14;
  parse_t *ps_local;
  
  if (ps->job->name == (char *)0x0) {
    utstring_printf(ps->em,"job has no name");
    ps->rc = -1;
  }
  if (ps->rc != -1) {
    if ((ps->job->cmdv).n < (ps->job->cmdv).i + 1) {
      while ((ps->job->cmdv).n < (ps->job->cmdv).i + 1) {
        if ((ps->job->cmdv).n == 0) {
          local_14 = 8;
        }
        else {
          local_14 = (ps->job->cmdv).n << 1;
        }
        (ps->job->cmdv).n = local_14;
      }
      pcVar5 = (char *)realloc((ps->job->cmdv).d,(ulong)(ps->job->cmdv).n * (ps->job->cmdv).icd.sz);
      (ps->job->cmdv).d = pcVar5;
      if (pcVar5 == (char *)0x0) {
        exit(-1);
      }
    }
    if ((ps->job->cmdv).icd.init == (undefined1 *)0x0) {
      memset((ps->job->cmdv).d + (ps->job->cmdv).icd.sz * (ulong)(ps->job->cmdv).i,0,
             (ps->job->cmdv).icd.sz);
    }
    else {
      (*(code *)(ps->job->cmdv).icd.init)
                ((ps->job->cmdv).d + (ps->job->cmdv).icd.sz * (ulong)(ps->job->cmdv).i);
    }
    (ps->job->cmdv).i = (ps->job->cmdv).i + 1;
    if (ps->cfg->jobs->n < ps->cfg->jobs->i + 1) {
      while (ps->cfg->jobs->n < ps->cfg->jobs->i + 1) {
        if (ps->cfg->jobs->n == 0) {
          local_18 = 8;
        }
        else {
          local_18 = ps->cfg->jobs->n << 1;
        }
        ps->cfg->jobs->n = local_18;
      }
      pcVar5 = (char *)realloc(ps->cfg->jobs->d,(ulong)ps->cfg->jobs->n * (ps->cfg->jobs->icd).sz);
      ps->cfg->jobs->d = pcVar5;
      if (pcVar5 == (char *)0x0) {
        exit(-1);
      }
    }
    if ((ps->cfg->jobs->icd).copy == (ctor_f *)0x0) {
      pcVar5 = ps->cfg->jobs->d;
      sVar3 = (ps->cfg->jobs->icd).sz;
      pUVar4 = ps->cfg->jobs;
      uVar1 = pUVar4->i;
      pUVar4->i = uVar1 + 1;
      memcpy(pcVar5 + sVar3 * uVar1,ps->job,(ps->cfg->jobs->icd).sz);
    }
    else {
      pcVar2 = (ps->cfg->jobs->icd).copy;
      pcVar5 = ps->cfg->jobs->d;
      sVar3 = (ps->cfg->jobs->icd).sz;
      pUVar4 = ps->cfg->jobs;
      uVar1 = pUVar4->i;
      pUVar4->i = uVar1 + 1;
      (*pcVar2)(pcVar5 + sVar3 * uVar1,ps->job);
    }
    job_fin(ps->job);
    job_ini(ps->job);
  }
  return;
}

Assistant:

void push_job(parse_t *ps) {

  /* final validation */
  if (!ps->job->name) {
      utstring_printf(ps->em, "job has no name");
      ps->rc = -1;
  }

  if (ps->rc == -1) return;

  /* okay. polish it off and copy it into the jobs */
  utarray_extend_back(&ps->job->cmdv); /* put NULL on end of argv */
  utarray_push_back(ps->cfg->jobs, ps->job);
  /* reset job for another parse */
  job_fin(ps->job); 
  job_ini(ps->job);
}